

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O1

int lj_cf_rawset(lua_State *L)

{
  TValue *pTVar1;
  TValue *pTVar2;
  int narg;
  
  pTVar1 = L->base;
  pTVar2 = L->top;
  if ((pTVar1 < pTVar2) && ((pTVar1->field_2).it == 0xfffffff4)) {
    if (pTVar1 + 1 < pTVar2) {
      if (pTVar1 + 2 < pTVar2) {
        L->top = pTVar1 + 3;
        lua_rawset(L,1);
        return 1;
      }
      narg = 3;
    }
    else {
      narg = 2;
    }
    lj_err_arg(L,narg,LJ_ERR_NOVAL);
  }
  lj_err_argt(L,1,5);
}

Assistant:

LJLIB_CF(rawset)		LJLIB_REC(.)
{
  lj_lib_checktab(L, 1);
  lj_lib_checkany(L, 2);
  L->top = 1+lj_lib_checkany(L, 3);
  lua_rawset(L, 1);
  return 1;
}